

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O0

uint32_t NgramBuilder_add_ngram
                   (NgramBuilder builder,uint32_t *wids,uint32_t order,uint32_t prob,uint32_t bow)

{
  size_t sVar1;
  char *pcVar2;
  char local_428 [4];
  uint32_t len;
  char encode_buff [1024];
  uint32_t bow_local;
  uint32_t prob_local;
  uint32_t order_local;
  uint32_t *wids_local;
  NgramBuilder builder_local;
  
  encode_buff._1020_4_ = bow;
  sVar1 = _encode_gram(wids,order,prob,bow,local_428);
  if ((uint)sVar1 < 0x401) {
    builder->added_gram_nums[order - 1] = builder->added_gram_nums[order - 1] + 1;
    pcVar2 = _NgramBuilder_cp_str(builder,local_428,sVar1 & 0xffffffff);
    sVar1 = builder->added_total_gram_num;
    builder->added_total_gram_num = sVar1 + 1;
    builder->ngram_offsets[sVar1] = pcVar2;
    return 0;
  }
  __assert_fail("len <= 1024",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c",
                0x1cc,
                "uint32_t NgramBuilder_add_ngram(NgramBuilder, const uint32_t *, uint32_t, uint32_t, uint32_t)"
               );
}

Assistant:

uint32_t NgramBuilder_add_ngram(NgramBuilder builder, const uint32_t* wids, uint32_t order, uint32_t prob, uint32_t bow){
    char encode_buff[1024];//actually is 3 + order*4
    uint32_t len = _encode_gram(wids, order, prob, bow, encode_buff);
    
    assert(len <= 1024);
    builder->added_gram_nums[order-1]++;
    builder->ngram_offsets[builder->added_total_gram_num++] = _NgramBuilder_cp_str(builder, encode_buff, len);
    return 0; 
}